

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

uint8_t * __thiscall
CoreML::Specification::RandomUniformStaticLayerParams::_InternalSerialize
          (RandomUniformStaticLayerParams *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  ulong *puVar1;
  float fVar2;
  void *data;
  bool bVar3;
  LogMessage *other;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  byte *ptr;
  ulong *puVar9;
  undefined8 *puVar10;
  size_t __n;
  byte *pbVar11;
  LogFinisher local_69;
  LogMessage local_68;
  
  ptr = target;
  if (this->seed_ != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar5 = this->seed_;
    *target = '\b';
    target[1] = (byte)uVar5;
    if (uVar5 < 0x80) {
      ptr = target + 2;
    }
    else {
      target[1] = (byte)uVar5 | 0x80;
      target[2] = (uint8_t)(uVar5 >> 7);
      ptr = target + 3;
      if (0x3fff < uVar5) {
        uVar6 = (ulong)target[2];
        uVar5 = uVar5 >> 7;
        do {
          ptr[-1] = (byte)uVar6 | 0x80;
          uVar4 = uVar5 >> 7;
          *ptr = (byte)uVar4;
          ptr = ptr + 1;
          uVar6 = uVar4 & 0xffffffff;
          bVar3 = 0x3fff < uVar5;
          uVar5 = uVar4;
        } while (bVar3);
      }
    }
  }
  if (this->minval_ != 0.0) {
    if (stream->end_ <= ptr) {
      ptr = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,ptr);
    }
    fVar2 = this->minval_;
    *ptr = 0x15;
    *(float *)(ptr + 1) = fVar2;
    ptr = ptr + 5;
  }
  if (this->maxval_ != 0.0) {
    if (stream->end_ <= ptr) {
      ptr = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,ptr);
    }
    fVar2 = this->maxval_;
    *ptr = 0x1d;
    *(float *)(ptr + 1) = fVar2;
    ptr = ptr + 5;
  }
  uVar8 = (this->_outputshape_cached_byte_size_).super___atomic_base<int>._M_i;
  if (0 < (int)uVar8) {
    if (stream->end_ <= ptr) {
      ptr = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,ptr);
    }
    if (stream->end_ <= ptr) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x36d);
      other = google::protobuf::internal::LogMessage::operator<<
                        (&local_68,"CHECK failed: ptr < end_: ");
      google::protobuf::internal::LogFinisher::operator=(&local_69,other);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
    }
    *ptr = 0x22;
    pbVar11 = ptr + 1;
    uVar7 = uVar8;
    if (0x7f < uVar8) {
      do {
        ptr = pbVar11;
        *ptr = (byte)uVar7 | 0x80;
        uVar8 = uVar7 >> 7;
        pbVar11 = ptr + 1;
        bVar3 = 0x3fff < uVar7;
        uVar7 = uVar8;
      } while (bVar3);
    }
    ptr = ptr + 2;
    *pbVar11 = (byte)uVar8;
    puVar9 = (ulong *)(this->outputshape_).arena_or_elements_;
    puVar1 = puVar9 + (this->outputshape_).current_size_;
    do {
      if (stream->end_ <= ptr) {
        ptr = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,ptr);
      }
      uVar5 = *puVar9;
      *ptr = (byte)uVar5;
      if (uVar5 < 0x80) {
        pbVar11 = ptr + 1;
      }
      else {
        *ptr = (byte)uVar5 | 0x80;
        ptr[1] = (byte)(uVar5 >> 7);
        pbVar11 = ptr + 2;
        if (0x3fff < uVar5) {
          uVar6 = (ulong)ptr[1];
          uVar5 = uVar5 >> 7;
          do {
            pbVar11[-1] = (byte)uVar6 | 0x80;
            uVar4 = uVar5 >> 7;
            *pbVar11 = (byte)uVar4;
            pbVar11 = pbVar11 + 1;
            uVar6 = uVar4 & 0xffffffff;
            bVar3 = 0x3fff < uVar5;
            uVar5 = uVar4;
          } while (bVar3);
        }
      }
      ptr = pbVar11;
      puVar9 = puVar9 + 1;
    } while (puVar9 < puVar1);
  }
  uVar5 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar5 & 1) != 0) {
    data = *(void **)((uVar5 & 0xfffffffffffffffc) + 8);
    uVar5 = (this->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar5 & 1) == 0) {
      puVar10 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
      if ((google::protobuf::internal::init_protobuf_defaults_state & 1) == 0) {
        google::protobuf::internal::InitProtobufDefaultsSlow();
      }
    }
    else {
      puVar10 = (undefined8 *)((uVar5 & 0xfffffffffffffffc) + 8);
    }
    __n = (size_t)(int)puVar10[1];
    if ((long)stream->end_ - (long)ptr < (long)__n) {
      ptr = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                      (stream,data,(int)puVar10[1],ptr);
    }
    else {
      memcpy(ptr,data,__n);
      ptr = ptr + __n;
    }
  }
  return ptr;
}

Assistant:

uint8_t* RandomUniformStaticLayerParams::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.RandomUniformStaticLayerParams)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 seed = 1;
  if (this->_internal_seed() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt64ToArray(1, this->_internal_seed(), target);
  }

  // float minVal = 2;
  static_assert(sizeof(uint32_t) == sizeof(float), "Code assumes uint32_t and float are the same size.");
  float tmp_minval = this->_internal_minval();
  uint32_t raw_minval;
  memcpy(&raw_minval, &tmp_minval, sizeof(tmp_minval));
  if (raw_minval != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteFloatToArray(2, this->_internal_minval(), target);
  }

  // float maxVal = 3;
  static_assert(sizeof(uint32_t) == sizeof(float), "Code assumes uint32_t and float are the same size.");
  float tmp_maxval = this->_internal_maxval();
  uint32_t raw_maxval;
  memcpy(&raw_maxval, &tmp_maxval, sizeof(tmp_maxval));
  if (raw_maxval != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteFloatToArray(3, this->_internal_maxval(), target);
  }

  // repeated uint64 outputShape = 4;
  {
    int byte_size = _outputshape_cached_byte_size_.load(std::memory_order_relaxed);
    if (byte_size > 0) {
      target = stream->WriteUInt64Packed(
          4, _internal_outputshape(), byte_size, target);
    }
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.RandomUniformStaticLayerParams)
  return target;
}